

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void destroyRootPage(Parse *pParse,int iTable,int iDb)

{
  uint iReg;
  Vdbe *pVVar1;
  int in_EDX;
  uint in_ESI;
  Parse *in_RDI;
  int r1;
  Vdbe *v;
  Parse *in_stack_ffffffffffffffd8;
  
  pVVar1 = sqlite3GetVdbe(in_stack_ffffffffffffffd8);
  iReg = sqlite3GetTempReg(in_RDI);
  if ((int)in_ESI < 2) {
    sqlite3ErrorMsg(in_RDI,"corrupt schema");
  }
  sqlite3VdbeAddOp3((Vdbe *)in_RDI,in_ESI,in_EDX,(int)((ulong)pVVar1 >> 0x20),(int)pVVar1);
  sqlite3MayAbort(in_RDI);
  sqlite3NestedParse(in_RDI,"UPDATE %Q.sqlite_master SET rootpage=%d WHERE #%d AND rootpage=#%d",
                     in_RDI->db->aDb[in_EDX].zDbSName,(ulong)in_ESI,(ulong)iReg,(ulong)iReg);
  sqlite3ReleaseTempReg(in_RDI,iReg);
  return;
}

Assistant:

static void destroyRootPage(Parse *pParse, int iTable, int iDb){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int r1 = sqlite3GetTempReg(pParse);
  if( iTable<2 ) sqlite3ErrorMsg(pParse, "corrupt schema");
  sqlite3VdbeAddOp3(v, OP_Destroy, iTable, r1, iDb);
  sqlite3MayAbort(pParse);
#ifndef SQLITE_OMIT_AUTOVACUUM
  /* OP_Destroy stores an in integer r1. If this integer
  ** is non-zero, then it is the root page number of a table moved to
  ** location iTable. The following code modifies the sqlite_schema table to
  ** reflect this.
  **
  ** The "#NNN" in the SQL is a special constant that means whatever value
  ** is in register NNN.  See grammar rules associated with the TK_REGISTER
  ** token for additional information.
  */
  sqlite3NestedParse(pParse,
     "UPDATE %Q." LEGACY_SCHEMA_TABLE
     " SET rootpage=%d WHERE #%d AND rootpage=#%d",
     pParse->db->aDb[iDb].zDbSName, iTable, r1, r1);
#endif
  sqlite3ReleaseTempReg(pParse, r1);
}